

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ReduceLoadSize::ReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  IRContext *this_00;
  uint __line;
  ReduceLoadSize *pRVar1;
  uint32_t uVar2;
  StorageClass storage_class;
  uint32_t uVar3;
  DefUseManager *this_01;
  TypeManager *this_02;
  ConstantManager *this_03;
  Instruction *pIVar4;
  Type *pTVar5;
  Instruction *pIVar6;
  Constant *c;
  uint32_t i;
  char *__assertion;
  uint32_t local_f0;
  uint32_t local_ec;
  ReduceLoadSize *local_e8;
  Type *local_e0;
  uint32_t local_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  InstructionBuilder ir_builder;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Integer int_type;
  
  if (inst->opcode_ != OpCompositeExtract) {
    __assertion = 
    "inst->opcode() == spv::Op::OpCompositeExtract && \"Wrong opcode.  Should be OpCompositeExtract.\""
    ;
    __line = 0x33;
LAB_00455b5c:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                  ,__line,"bool spvtools::opt::ReduceLoadSize::ReplaceExtract(Instruction *)");
  }
  this_01 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  this_02 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_e8 = this;
  this_03 = IRContext::get_constant_mgr((this->super_Pass).context_);
  uVar2 = Instruction::GetSingleWordInOperand(inst,0);
  pIVar4 = analysis::DefUseManager::GetDef(this_01,uVar2);
  if (pIVar4->opcode_ == OpLoad) {
    uVar2 = Instruction::type_id(pIVar4);
    pTVar5 = analysis::TypeManager::GetType(this_02,uVar2);
    if ((((pTVar5->kind_ & ~kBool) != kVector) &&
        (pIVar6 = Instruction::GetBaseAddress(pIVar4), pIVar6 != (Instruction *)0x0)) &&
       (pIVar6->opcode_ == OpVariable)) {
      storage_class = Instruction::GetSingleWordInOperand(pIVar6,0);
      if (StorageClassUniform < storage_class) {
        return false;
      }
      InstructionBuilder::InstructionBuilder
                (&ir_builder,inst->context_,pIVar4,kAnalysisInstrToBlockMapping|kAnalysisBegin);
      uVar2 = Instruction::type_id(inst);
      local_ec = analysis::TypeManager::FindPointerToType(this_02,uVar2,storage_class);
      if (local_ec != 0) {
        int_type.super_Type.decorations_.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        int_type.super_Type.decorations_.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        int_type.super_Type.decorations_.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        int_type.super_Type.kind_ = kInteger;
        int_type.super_Type._36_4_ = 0x20;
        int_type.super_Type._vptr_Type = (_func_int **)&PTR__Type_00a6c948;
        int_type.signed_ = false;
        local_e0 = analysis::TypeManager::GetRegisteredType(this_02,&int_type.super_Type);
        ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar2 = 1; uVar3 = Instruction::NumInOperands(inst), uVar2 < uVar3; uVar2 = uVar2 + 1)
        {
          local_f0 = Instruction::GetSingleWordInOperand(inst,uVar2);
          local_d8[0] = 0;
          local_d8[1] = 0;
          local_d8[2] = 0;
          local_d8[3] = 0;
          local_d8[4] = 0;
          local_d8[5] = 0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_range_initialize<unsigned_int_const*>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_d8,&local_f0,
                     &local_ec);
          c = analysis::ConstantManager::GetConstant
                        (this_03,local_e0,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
          pIVar6 = analysis::ConstantManager::GetDefiningInstruction
                             (this_03,c,0,(inst_iterator *)0x0);
          uVar3 = Instruction::result_id(pIVar6);
          local_d8[0] = uVar3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&ids,(uint *)local_d8);
        }
        uVar2 = Instruction::GetSingleWordInOperand(pIVar4,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        pIVar4 = InstructionBuilder::AddAccessChain
                           (&ir_builder,local_ec,uVar2,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
        uVar2 = Instruction::type_id(inst);
        uVar3 = Instruction::result_id(pIVar4);
        pIVar4 = InstructionBuilder::AddLoad(&ir_builder,uVar2,uVar3,0);
        pRVar1 = local_e8;
        this_00 = (local_e8->super_Pass).context_;
        uVar2 = Instruction::result_id(inst);
        uVar3 = Instruction::result_id(pIVar4);
        IRContext::ReplaceAllUsesWith(this_00,uVar2,uVar3);
        IRContext::KillInst((pRVar1->super_Pass).context_,inst);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        analysis::Type::~Type(&int_type.super_Type);
        return true;
      }
      __assertion = 
      "pointer_to_result_type_id != 0 && \"We did not find the pointer type that we need.\"";
      __line = 0x60;
      local_ec = 0;
      goto LAB_00455b5c;
    }
  }
  return false;
}

Assistant:

bool ReduceLoadSize::ReplaceExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract &&
         "Wrong opcode.  Should be OpCompositeExtract.");
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  uint32_t composite_id =
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* composite_inst = def_use_mgr->GetDef(composite_id);

  if (composite_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  analysis::Type* composite_type = type_mgr->GetType(composite_inst->type_id());
  if (composite_type->kind() == analysis::Type::kVector ||
      composite_type->kind() == analysis::Type::kMatrix) {
    return false;
  }

  Instruction* var = composite_inst->GetBaseAddress();
  if (var == nullptr || var->opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class = static_cast<spv::StorageClass>(
      var->GetSingleWordInOperand(kVariableStorageClassInIdx));
  switch (storage_class) {
    case spv::StorageClass::Uniform:
    case spv::StorageClass::UniformConstant:
    case spv::StorageClass::Input:
      break;
    default:
      return false;
  }

  // Create a new access chain and load just after the old load.
  // We cannot create the new access chain load in the position of the extract
  // because the storage may have been written to in between.
  InstructionBuilder ir_builder(
      inst->context(), composite_inst,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);

  uint32_t pointer_to_result_type_id =
      type_mgr->FindPointerToType(inst->type_id(), storage_class);
  assert(pointer_to_result_type_id != 0 &&
         "We did not find the pointer type that we need.");

  analysis::Integer int_type(32, false);
  const analysis::Type* uint32_type = type_mgr->GetRegisteredType(&int_type);
  std::vector<uint32_t> ids;
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    uint32_t index = inst->GetSingleWordInOperand(i);
    const analysis::Constant* index_const =
        const_mgr->GetConstant(uint32_type, {index});
    ids.push_back(const_mgr->GetDefiningInstruction(index_const)->result_id());
  }

  Instruction* new_access_chain = ir_builder.AddAccessChain(
      pointer_to_result_type_id,
      composite_inst->GetSingleWordInOperand(kLoadPointerInIdx), ids);
  Instruction* new_load =
      ir_builder.AddLoad(inst->type_id(), new_access_chain->result_id());

  context()->ReplaceAllUsesWith(inst->result_id(), new_load->result_id());
  context()->KillInst(inst);
  return true;
}